

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O0

Gia_Man_t * Abc_EnumeratePaths(int nSize)

{
  int iVar1;
  int iVar2;
  int iLit1;
  Gia_Man_t *p;
  int *__ptr;
  Gia_Man_t *pGVar3;
  int iVer;
  int iHor;
  int nVars;
  int y;
  int x;
  int *pNodes;
  Gia_Man_t *pGia;
  Gia_Man_t *pTemp;
  int nSize_local;
  
  p = Gia_ManStart(10000);
  __ptr = (int *)calloc((long)(nSize + 1),4);
  for (nVars = 0; nVars < nSize * 2 * (nSize + 1); nVars = nVars + 1) {
    Gia_ManAppendCi(p);
  }
  Gia_ManHashAlloc(p);
  *__ptr = 1;
  for (nVars = 1; nVars <= nSize; nVars = nVars + 1) {
    iVar2 = __ptr[nVars + -1];
    iVar1 = Abc_NodeVarX(nSize,0,nVars);
    iVar2 = Gia_ManHashAnd(p,iVar2,iVar1);
    __ptr[nVars] = iVar2;
  }
  for (iHor = 1; iHor <= nSize; iHor = iHor + 1) {
    iVar2 = *__ptr;
    iVar1 = Abc_NodeVarY(nSize,iHor,0);
    iVar2 = Gia_ManHashAnd(p,iVar2,iVar1);
    *__ptr = iVar2;
    for (nVars = 1; nVars <= nSize; nVars = nVars + 1) {
      iVar2 = __ptr[nVars + -1];
      iVar1 = Abc_NodeVarX(nSize,iHor,nVars);
      iVar1 = Gia_ManHashAnd(p,iVar2,iVar1);
      iVar2 = __ptr[nVars];
      iLit1 = Abc_NodeVarY(nSize,iHor,nVars);
      iVar2 = Gia_ManHashAnd(p,iVar2,iLit1);
      iVar2 = Gia_ManHashOr(p,iVar1,iVar2);
      __ptr[nVars] = iVar2;
    }
  }
  Gia_ManAppendCo(p,__ptr[nSize]);
  pGVar3 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  return pGVar3;
}

Assistant:

Gia_Man_t * Abc_EnumeratePaths( int nSize )
{
    Gia_Man_t * pTemp, * pGia = Gia_ManStart( 10000 );
    int * pNodes = ABC_CALLOC( int, nSize+1 );
    int x, y, nVars = 2*nSize*(nSize+1);
    for ( x = 0; x < nVars; x++ )
        Gia_ManAppendCi( pGia );
    Gia_ManHashAlloc( pGia );
    // y = 0; x = 0;
    pNodes[0] = 1;
    // y = 0; x > 0 
    for ( x = 1; x <= nSize; x++ )
        pNodes[x] = Gia_ManHashAnd( pGia, pNodes[x-1], Abc_NodeVarX(nSize, 0, x) );
    // y > 0; x >= 0
    for ( y = 1; y <= nSize; y++ )
    {
        // y > 0; x = 0
        pNodes[0] = Gia_ManHashAnd( pGia, pNodes[0], Abc_NodeVarY(nSize, y, 0) );
        // y > 0; x > 0
        for ( x = 1; x <= nSize; x++ )
        {
            int iHor  = Gia_ManHashAnd( pGia, pNodes[x-1], Abc_NodeVarX(nSize, y, x) );
            int iVer  = Gia_ManHashAnd( pGia, pNodes[x],   Abc_NodeVarY(nSize, y, x) );
            pNodes[x] = Gia_ManHashOr( pGia, iHor, iVer );
        }
    }
    Gia_ManAppendCo( pGia, pNodes[nSize] );
    pGia = Gia_ManCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    ABC_FREE( pNodes );
    return pGia;
}